

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ImageFeatureType_ImageSizeRange * __thiscall
CoreML::Specification::ImageFeatureType::_internal_mutable_imagesizerange(ImageFeatureType *this)

{
  bool bVar1;
  Arena *arena;
  ImageFeatureType_ImageSizeRange *pIVar2;
  ImageFeatureType *this_local;
  
  bVar1 = _internal_has_imagesizerange(this);
  if (!bVar1) {
    clear_SizeFlexibility(this);
    set_has_imagesizerange(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pIVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ImageFeatureType_ImageSizeRange>(arena);
    (this->SizeFlexibility_).imagesizerange_ = pIVar2;
  }
  return (ImageFeatureType_ImageSizeRange *)(this->SizeFlexibility_).enumeratedsizes_;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_ImageSizeRange* ImageFeatureType::_internal_mutable_imagesizerange() {
  if (!_internal_has_imagesizerange()) {
    clear_SizeFlexibility();
    set_has_imagesizerange();
    SizeFlexibility_.imagesizerange_ = CreateMaybeMessage< ::CoreML::Specification::ImageFeatureType_ImageSizeRange >(GetArenaForAllocation());
  }
  return SizeFlexibility_.imagesizerange_;
}